

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_buf.c
# Opt level: O1

char * lj_buf_tmp(lua_State *L,MSize sz)

{
  char *pcVar1;
  ulong uVar2;
  
  uVar2 = (ulong)(L->glref).ptr32;
  *(int *)(uVar2 + 0xf4) = (int)L;
  if (sz <= *(int *)(uVar2 + 0xec) - *(uint *)(uVar2 + 0xf0)) {
    return (char *)(ulong)*(uint *)(uVar2 + 0xf0);
  }
  pcVar1 = lj_buf_need2((SBuf *)(uVar2 + 0xe8),sz);
  return pcVar1;
}

Assistant:

char * LJ_FASTCALL lj_buf_tmp(lua_State *L, MSize sz)
{
  SBuf *sb = &G(L)->tmpbuf;
  setsbufL(sb, L);
  return lj_buf_need(sb, sz);
}